

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O3

void sendtftp(testcase *test,formats *pf)

{
  int convert;
  ulong uVar1;
  ssize_t sVar2;
  int *piVar3;
  char *msg;
  int iVar4;
  bool bVar5;
  sigaction local_c8;
  
  sendblock = 1;
  memset(&local_c8.sa_mask,0,0x90);
  local_c8.__sigaction_handler.sa_handler = timer;
  sigaction(0xe,&local_c8,(sigaction *)0x0);
  newline = 0;
  prevchar = -1;
  bfs[0].counter = -3;
  current = 0;
  bfs[1].counter = -2;
  nextone = 1;
  sdp = (tftphdr *)&bfs[0].buf;
LAB_00105d0c:
  convert = pf->f_convert;
  bVar5 = (ulong)(uint)current == 0;
  bfs[(uint)current].counter = -2;
  current = (int)bVar5;
  uVar1 = (ulong)((uint)bVar5 * 0x200 + (uint)bVar5 * 8);
  iVar4 = *(int *)((long)&bfs[0].counter + uVar1);
  if (iVar4 == -2) {
    read_ahead(test,convert);
    iVar4 = *(int *)((long)&bfs[0].counter + uVar1);
  }
  sdp = (tftphdr *)((long)&bfs[0].buf + uVar1);
  if (iVar4 < 0) {
    piVar3 = __errno_location();
    nak(*piVar3 + 100);
  }
  else {
    *(undefined2 *)((long)&bfs[0].buf + uVar1) = 0x300;
    *(unsigned_short *)((long)&bfs[0].buf + uVar1 + 2) = sendblock << 8 | sendblock >> 8;
    timeout = 0;
    __sigsetjmp(timeoutbuf,1);
    while (uVar1 = send(peer,sdp,(ulong)(iVar4 + 4),0x4000), uVar1 == iVar4 + 4) {
      read_ahead(test,pf->f_convert);
      do {
        while( true ) {
          alarm(5);
          sVar2 = recv(peer,&ackbuf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sVar2 < 0) {
            msg = "read: fail";
            goto LAB_00105ead;
          }
          ackbuf.hdr.th_opcode = ackbuf.hdr.th_opcode << 8 | (ushort)ackbuf.hdr.th_opcode >> 8;
          ackbuf._2_2_ = ackbuf._2_2_ << 8 | (ushort)ackbuf._2_2_ >> 8;
          if (ackbuf.hdr.th_opcode == 4) break;
          if (ackbuf.hdr.th_opcode == 5) {
            msg = "got ERROR";
            goto LAB_00105ead;
          }
        }
        if (ackbuf._2_2_ == sendblock) {
          sendblock = ackbuf._2_2_ + 1;
          if (iVar4 != 0x200) {
            return;
          }
          goto LAB_00105d0c;
        }
        synchnet(peer);
      } while (sendblock - 1 != (uint)(ushort)ackbuf._2_2_);
    }
    msg = "write";
LAB_00105ead:
    logmsg(msg);
  }
  return;
}

Assistant:

static void sendtftp(struct testcase *test, struct formats *pf)
{
  int size;
  ssize_t n;
  sendblock = 1;
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  sdp = r_init();
  sap = &ackbuf.hdr;
  do {
    size = readit(test, &sdp, pf->f_convert);
    if (size < 0) {
      nak(ERRNO + 100);
      return;
    }
    sdp->th_opcode = htons((unsigned short)opcode_DATA);
    sdp->th_block = htons(sendblock);
    timeout = 0;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
    send_data:
    if (swrite(peer, sdp, size + 4) != size + 4) {
      logmsg("write");
      return;
    }
    read_ahead(test, pf->f_convert);
    for ( ; ; ) {
#ifdef HAVE_ALARM
      alarm(rexmtval);        /* read the ack */
#endif
      n = sread(peer, &ackbuf.storage[0], sizeof(ackbuf.storage));
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        return;
      if (n < 0) {
        logmsg("read: fail");
        return;
      }
      sap->th_opcode = ntohs((unsigned short)sap->th_opcode);
      sap->th_block = ntohs(sap->th_block);

      if (sap->th_opcode == opcode_ERROR) {
        logmsg("got ERROR");
        return;
      }

      if (sap->th_opcode == opcode_ACK) {
        if (sap->th_block == sendblock) {
          break;
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if (sap->th_block == (sendblock-1)) {
          goto send_data;
        }
      }

    }
    sendblock++;
  } while (size == SEGSIZE);
}